

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::torrent_handle::
sync_call<void(libtorrent::aux::torrent::*)(std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*)const,std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*&>
          (torrent_handle *this,offset_in_torrent_to_subr f,
          vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
          **a)

{
  session_impl *ses;
  io_context *ctx;
  undefined8 uVar1;
  undefined8 *in_RCX;
  bool done;
  exception_ptr ex;
  shared_ptr<libtorrent::aux::torrent> t;
  bool local_91;
  exception_ptr local_90;
  exception_ptr local_88;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_80;
  undefined1 local_70 [56];
  vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_> *local_38;
  
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,this);
  if (local_80._M_ptr == (element_type *)0x0) {
    local_70._0_4_ = 0x14;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)local_70);
  }
  ses = (session_impl *)((local_80._M_ptr)->super_torrent_hot_members).m_ses;
  local_70._0_8_ = &local_91;
  local_91 = false;
  local_70._16_8_ = &local_90;
  local_90._M_exception_object = (void *)0x0;
  ctx = ses->m_io_context;
  local_70._8_8_ = ses;
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x18)
             ,&local_80);
  local_38 = (vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
              *)*in_RCX;
  local_70._40_8_ = f;
  local_70._48_8_ = a;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::torrent_handle::sync_call<void(libtorrent::aux::torrent::*)(std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*)const,std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*&>(void(libtorrent::aux::torrent::*)(std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*)const,std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>*&)const::_lambda()_1_>
            (ctx,(type_conflict4 *)local_70,(type *)0x0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x20));
  aux::torrent_wait(&local_91,ses);
  if (local_90._M_exception_object == (void *)0x0) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_90);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
    return;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_88,&local_90);
  uVar1 = ::std::rethrow_exception((exception_ptr)&local_88);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_88);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_90);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  _Unwind_Resume(uVar1);
}

Assistant:

void torrent_handle::sync_call(Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		if (!t) aux::throw_ex<system_error>(errors::invalid_torrent_handle);
		auto& ses = static_cast<session_impl&>(t->session());

		// this is the flag to indicate the call has completed
		bool done = false;

		std::exception_ptr ex;
		dispatch(ses.get_context(), [=,&done,&ses,&ex] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(ses.mut);
			done = true;
			ses.cond.notify_all();
		} );

		aux::torrent_wait(done, ses);
		if (ex) std::rethrow_exception(ex);
	}